

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

bool __thiscall
QItemSelectionRangeRefCache::contains
          (QItemSelectionRangeRefCache *this,int row,int column,QModelIndex *parentIndex)

{
  int in_EDX;
  int in_ESI;
  QModelIndex *in_RDI;
  uint7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  undefined1 uVar1;
  
  populate((QItemSelectionRangeRefCache *)
           CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  uVar1 = false;
  if ((((in_ESI <= (int)in_RDI->i) && (uVar1 = false, in_EDX <= *(int *)((long)&in_RDI->i + 4))) &&
      (uVar1 = false, in_RDI->r <= in_ESI)) && (uVar1 = false, in_RDI->c <= in_EDX)) {
    parent((QItemSelectionRangeRefCache *)(ulong)in_stack_ffffffffffffffe0);
    uVar1 = ::operator==((QModelIndex *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),in_RDI);
  }
  return (bool)uVar1;
}

Assistant:

inline bool contains(int row, int column, const QModelIndex &parentIndex)
    {
        populate();
        return (m_bottom >= row && m_right >= column &&
                m_top    <= row && m_left  <= column &&
                parent() == parentIndex);
    }